

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O2

void save_pick(memfile *mf)

{
  int8_t value;
  long lVar1;
  int8_t value_00;
  int32_t value_01;
  
  if (xlock_4 == 0) {
    value_00 = '\0';
    value = '\0';
    value_01 = 0;
  }
  else {
    if (xlock_0 == (undefined1 *)0x0) {
      value_01 = *(int32_t *)(xlock_1 + 0x18);
    }
    else {
      lVar1 = (long)level->locations - (long)xlock_0;
      value_01 = 0;
      if (xlock_0 < (undefined1 *)((long)level->objects[1] + 0x54) &&
          (level->locations < xlock_0 || lVar1 == 0)) {
        value_00 = (int8_t)((lVar1 / 0xc) % 0x50);
        value = (int8_t)(lVar1 / 0x3c0);
        goto LAB_001ad572;
      }
    }
    value_00 = '\0';
    value = '\0';
  }
LAB_001ad572:
  mwrite32(mf,xlock_2);
  mwrite32(mf,xlock_3);
  mwrite32(mf,xlock_4);
  mwrite8(mf,xlock_5);
  mwrite8(mf,value_00);
  mwrite8(mf,value);
  mwrite32(mf,value_01);
  mwrite8(mf,picklock_dx);
  mwrite8(mf,picklock_dy);
  return;
}

Assistant:

void save_pick(struct memfile *mf)
{
	schar door_x = 0;
	schar door_y = 0;
	unsigned int box_id = 0;

	/* avoid dereferencing dangling pointers here */
	if (xlock.usedtime) {
	    if (xlock.door) {
		/* make sure the door is on the current level */
		if (&level->locations[0][0] <= xlock.door &&
		    xlock.door < &level->locations[COLNO][ROWNO]) {
		    door_x = (&level->locations[0][0] - xlock.door) % COLNO;
		    door_y = (&level->locations[0][0] - xlock.door) / COLNO;
		}
	    } else {
		box_id = xlock.box->o_id;
	    }
	}

	mwrite32(mf, xlock.picktyp);
	mwrite32(mf, xlock.chance);
	mwrite32(mf, xlock.usedtime);
	mwrite8(mf, xlock.loot_unlocked);
	mwrite8(mf, door_x);
	mwrite8(mf, door_y);
	mwrite32(mf, box_id);

	mwrite8(mf, picklock_dx);
	mwrite8(mf, picklock_dy);
}